

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<bool_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<bool_const&> *this,bool *rhs)

{
  lest *this_00;
  bool *in_R8;
  allocator local_41;
  string local_40 [32];
  
  this_00 = *(lest **)this;
  __return_storage_ptr__->passed = *this_00 == (lest)*rhs;
  std::__cxx11::string::string(local_40,"==",&local_41);
  to_string<bool,bool>
            (&__return_storage_ptr__->decomposition,this_00,(bool *)local_40,(string *)rhs,in_R8);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result{ lhs <= rhs, to_string( lhs, "<=", rhs ) }; }